

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O1

void __thiscall
PrintVisitor::visit(PrintVisitor *this,Expression *parent,NumberExpression *expression)

{
  ostream *poVar1;
  NumericConstant *this_00;
  string local_30;
  
  poVar1 = this->mStream;
  this_00 = NumberExpression::value(expression);
  NumericConstant::toString_abi_cxx11_(&local_30,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PrintVisitor::visit(Expression* parent, NumberExpression* expression) {
	mStream << expression->value().toString();
}